

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureCompletenessTests::init
          (TextureCompletenessTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *node;
  Incomplete2DSizeCase *pIVar3;
  Incomplete2DFormatCase *pIVar4;
  Incomplete2DMissingLevelCase *pIVar5;
  Incomplete2DWrapModeCase *pIVar6;
  TestNode *pTVar7;
  IncompleteCubeSizeCase *pIVar8;
  IncompleteCubeFormatCase *pIVar9;
  IncompleteCubeMissingLevelCase *pIVar10;
  IncompleteCubeWrapModeCase *pIVar11;
  IVec2 local_1b8;
  IVec2 local_1b0;
  IVec2 local_1a8;
  IVec2 local_1a0;
  IVec2 local_198;
  IVec2 local_190;
  IVec2 local_188;
  IVec2 local_180;
  IVec2 local_178;
  IVec2 local_170;
  IVec2 local_168;
  IVec2 local_160;
  IVec2 local_158;
  IVec2 local_150;
  IVec2 local_148;
  IVec2 local_140;
  IVec2 local_138;
  IVec2 local_130;
  IVec2 local_128;
  IVec2 local_120;
  IVec2 local_118;
  IVec2 local_110;
  IVec2 local_108;
  IVec2 local_100;
  IVec2 local_f8;
  IVec2 local_f0;
  IVec2 local_e8;
  IVec2 local_e0;
  IVec2 local_d8;
  IVec2 local_d0;
  IVec2 local_c8;
  IVec2 local_c0;
  IVec2 local_b8;
  IVec2 local_b0;
  IVec2 local_a8;
  IVec2 local_a0;
  IVec2 local_98;
  IVec2 local_90;
  IVec2 local_88;
  IVec2 local_80;
  IVec2 local_78;
  IVec2 local_70;
  IVec2 local_68;
  IVec2 local_60;
  IVec2 local_58;
  IVec2 local_50;
  IVec2 local_48;
  IVec2 local_40;
  IVec2 local_38;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D completeness");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap completeness");
  tcu::TestNode::addChild((TestNode *)this,node);
  pIVar3 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_38.m_data[0] = 0xff;
  local_38.m_data[1] = 0xff;
  local_40.m_data[0] = 0xff;
  local_40.m_data[1] = 0xff;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size","",&local_38,&local_40,0,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_48.m_data[0] = 0x100;
  local_48.m_data[1] = 0x100;
  local_50.m_data[0] = 0xff;
  local_50.m_data[1] = 0xff;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size_level_0","",&local_48,&local_50,0,pCVar1->m_contextInfo)
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_58.m_data[0] = 0x100;
  local_58.m_data[1] = 0x100;
  local_60.m_data[0] = 0x7f;
  local_60.m_data[1] = 0x7f;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size_level_1","",&local_58,&local_60,1,pCVar1->m_contextInfo)
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar3 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_68.m_data[0] = 0x100;
  local_68.m_data[1] = 0x100;
  local_70.m_data[0] = 0;
  local_70.m_data[1] = 0;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"not_positive_level_0","",&local_68,&local_70,0,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
  pIVar4 = (Incomplete2DFormatCase *)operator_new(0x98);
  local_78.m_data[0] = 0x80;
  local_78.m_data[1] = 0x80;
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"format_mismatch_rgb_rgba","",
             &local_78,0x1907,0x1908,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (Incomplete2DFormatCase *)operator_new(0x98);
  local_80.m_data[0] = 0x80;
  local_80.m_data[1] = 0x80;
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"format_mismatch_rgba_rgb","",
             &local_80,0x1908,0x1907,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (Incomplete2DFormatCase *)operator_new(0x98);
  local_88.m_data[0] = 0x80;
  local_88.m_data[1] = 0x80;
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_luminance_luminance_alpha","",&local_88,0x1909,0x190a,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar4 = (Incomplete2DFormatCase *)operator_new(0x98);
  local_90.m_data[0] = 0x80;
  local_90.m_data[1] = 0x80;
  Incomplete2DFormatCase::Incomplete2DFormatCase
            (pIVar4,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_luminance_alpha_luminance","",&local_90,0x190a,0x1909,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar4);
  pIVar5 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  local_98.m_data[0] = 0x80;
  local_98.m_data[1] = 0x80;
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_1","",&local_98,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  local_a0.m_data[0] = 0x80;
  local_a0.m_data[1] = 0x80;
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_3","",&local_a0,3);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar5 = (Incomplete2DMissingLevelCase *)operator_new(0x90);
  local_a8.m_data[0] = 0x80;
  local_a8.m_data[1] = 0x40;
  Incomplete2DMissingLevelCase::Incomplete2DMissingLevelCase
            (pIVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"last_level_missing","",&local_a8,
             7);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_b0.m_data[0] = 0x7f;
  local_b0.m_data[1] = 0x7f;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_t_repeat","",&local_b0,0x812f,0x2901,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_b8.m_data[0] = 0x7f;
  local_b8.m_data[1] = 0x7f;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_s_repeat","",&local_b8,0x2901,0x812f,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_c0.m_data[0] = 0x7f;
  local_c0.m_data[1] = 0x7f;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_all_repeat","",&local_c0,0x2901,0x2901,pCVar1->m_contextInfo)
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_c8.m_data[0] = 0x7f;
  local_c8.m_data[1] = 0x7f;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_mirrored_repeat","",&local_c8,0x8370,0x8370,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_d0.m_data[0] = 0x7f;
  local_d0.m_data[1] = 0x80;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"repeat_width_npot","",&local_d0,0x2901,0x2901,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_d8.m_data[0] = 0x80;
  local_d8.m_data[1] = 0x7f;
  Incomplete2DWrapModeCase::Incomplete2DWrapModeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"repeat_height_npot","",&local_d8,0x2901,0x2901,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar6);
  pTVar7 = (TestNode *)operator_new(0x90);
  local_e0.m_data[0] = 0x40;
  local_e0.m_data[1] = 0x40;
  Complete2DExtraLevelCase::Complete2DExtraLevelCase
            ((Complete2DExtraLevelCase *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"extra_level","",&local_e0);
  tcu::TestNode::addChild(pTVar2,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  local_e8.m_data[0] = 0x40;
  local_e8.m_data[1] = 0x40;
  Incomplete2DEmptyObjectCase::Incomplete2DEmptyObjectCase
            ((Incomplete2DEmptyObjectCase *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"empty_object","",&local_e8);
  tcu::TestNode::addChild(pTVar2,pTVar7);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_f0.m_data[0] = 0x40;
  local_f0.m_data[1] = 0x40;
  local_f8.m_data[0] = 0x3f;
  local_f8.m_data[1] = 0x3f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_0","",&local_f0,
             &local_f8,0);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_100.m_data[0] = 0x40;
  local_100.m_data[1] = 0x40;
  local_108.m_data[0] = 0x1f;
  local_108.m_data[1] = 0x1f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_1","",&local_100,
             &local_108,1);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_110.m_data[0] = 0x40;
  local_110.m_data[1] = 0x40;
  local_118.m_data[0] = 0x3f;
  local_118.m_data[1] = 0x3f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_0_pos_x","",
             &local_110,&local_118,0,CUBEFACE_POSITIVE_X);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_120.m_data[0] = 0x40;
  local_120.m_data[1] = 0x40;
  local_128.m_data[0] = 0x1f;
  local_128.m_data[1] = 0x1f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_1_neg_x","",
             &local_120,&local_128,1,CUBEFACE_NEGATIVE_X);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_130.m_data[0] = 0x40;
  local_130.m_data[1] = 0x40;
  local_138.m_data[0] = 0;
  local_138.m_data[1] = 0;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"not_positive_level_0","",
             &local_130,&local_138,0);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_140.m_data[0] = 0x40;
  local_140.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"format_mismatch_rgb_rgba_level_0"
             ,"",&local_140,0x1907,0x1908);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_148.m_data[0] = 0x40;
  local_148.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"format_mismatch_rgba_rgb_level_0"
             ,"",&local_148,0x1908,0x1907);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_150.m_data[0] = 0x40;
  local_150.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_luminance_luminance_alpha_level_0","",&local_150,0x1909,0x190a);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_158.m_data[0] = 0x40;
  local_158.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_luminance_alpha_luminance_level_0","",&local_158,0x190a,0x1909);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_160.m_data[0] = 0x40;
  local_160.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_rgb_rgba_level_0_pos_z","",&local_160,0x1907,0x1908,
             CUBEFACE_POSITIVE_Z);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar9 = (IncompleteCubeFormatCase *)operator_new(0x98);
  local_168.m_data[0] = 0x40;
  local_168.m_data[1] = 0x40;
  IncompleteCubeFormatCase::IncompleteCubeFormatCase
            (pIVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,
             "format_mismatch_rgba_rgb_level_0_neg_z","",&local_168,0x1908,0x1907,
             CUBEFACE_NEGATIVE_Z);
  tcu::TestNode::addChild(node,(TestNode *)pIVar9);
  pIVar10 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  local_170.m_data[0] = 0x40;
  local_170.m_data[1] = 0x40;
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_1","",&local_170,1)
  ;
  tcu::TestNode::addChild(node,(TestNode *)pIVar10);
  pIVar10 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  local_178.m_data[0] = 0x40;
  local_178.m_data[1] = 0x40;
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_3","",&local_178,3)
  ;
  tcu::TestNode::addChild(node,(TestNode *)pIVar10);
  pIVar10 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  local_180.m_data[0] = 0x40;
  local_180.m_data[1] = 0x40;
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_1_pos_y","",
             &local_180,1,CUBEFACE_POSITIVE_Y);
  tcu::TestNode::addChild(node,(TestNode *)pIVar10);
  pIVar10 = (IncompleteCubeMissingLevelCase *)operator_new(0x98);
  local_188.m_data[0] = 0x40;
  local_188.m_data[1] = 0x40;
  IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
            (pIVar10,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"missing_level_3_neg_y","",
             &local_188,3,CUBEFACE_NEGATIVE_Y);
  tcu::TestNode::addChild(node,(TestNode *)pIVar10);
  pIVar11 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_190.m_data[0] = 0x7f;
  local_190.m_data[1] = 0x7f;
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar11,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_t_repeat","",&local_190,0x812f,0x2901,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(node,(TestNode *)pIVar11);
  pIVar11 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_198.m_data[0] = 0x7f;
  local_198.m_data[1] = 0x7f;
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar11,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_s_repeat","",&local_198,0x2901,0x812f,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(node,(TestNode *)pIVar11);
  pIVar11 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_1a0.m_data[0] = 0x7f;
  local_1a0.m_data[1] = 0x7f;
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar11,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_all_repeat","",&local_1a0,0x2901,0x2901,pCVar1->m_contextInfo
            );
  tcu::TestNode::addChild(node,(TestNode *)pIVar11);
  pIVar11 = (IncompleteCubeWrapModeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_1a8.m_data[0] = 0x7f;
  local_1a8.m_data[1] = 0x7f;
  IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
            (pIVar11,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_mirrored_repeat","",&local_1a8,0x8370,0x8370,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(node,(TestNode *)pIVar11);
  pTVar2 = (TestNode *)operator_new(0x90);
  local_1b0.m_data[0] = 0x40;
  local_1b0.m_data[1] = 0x40;
  CompleteCubeExtraLevelCase::CompleteCubeExtraLevelCase
            ((CompleteCubeExtraLevelCase *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"extra_level","",&local_1b0);
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  local_1b8.m_data[0] = 0x40;
  local_1b8.m_data[1] = 0x40;
  IncompleteCubeEmptyObjectCase::IncompleteCubeEmptyObjectCase
            ((IncompleteCubeEmptyObjectCase *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"empty_object","",&local_1b8);
  tcu::TestNode::addChild(node,pTVar2);
  return extraout_EAX;
}

Assistant:

void TextureCompletenessTests::init (void)
{
	tcu::TestCaseGroup* tex2d = new tcu::TestCaseGroup(m_testCtx, "2d", "2D completeness");
	addChild(tex2d);
	tcu::TestCaseGroup* cube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap completeness");
	addChild(cube);

	// Texture 2D size.
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size",				"", IVec2(255, 255), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",		"", IVec2(256, 256), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",		"", IVec2(256, 256), IVec2(127, 127), 1, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",	"", IVec2(256, 256), IVec2(0, 0),	  0, m_context.getContextInfo()));
	// Texture 2D format.
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba",						"", IVec2(128, 128), GL_RGB,				GL_RGBA,			1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb",						"", IVec2(128, 128), GL_RGBA,				GL_RGB,				1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha",	"", IVec2(128, 128), GL_LUMINANCE,			GL_LUMINANCE_ALPHA,	1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance",	"", IVec2(128, 128), GL_LUMINANCE_ALPHA,	GL_LUMINANCE,		1));
	// Texture 2D missing level.
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",			"", IVec2(128, 128),	1));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",			"", IVec2(128, 128),	3));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "last_level_missing",			"", IVec2(128, 64),		de::max(deLog2Floor32(128), deLog2Floor32(64))));
	// Texture 2D wrap modes.
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_width_npot",		"", IVec2(127, 128), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_height_npot",		"", IVec2(128, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	// Texture 2D extra level.
	tex2d->addChild(new Complete2DExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Texture 2D empty object.
	tex2d->addChild(new Incomplete2DEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));

	// Cube size.
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",			"", IVec2(64, 64), IVec2(63, 63), 0));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",			"", IVec2(64, 64), IVec2(31, 31), 1));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0_pos_x",	"", IVec2(64, 64), IVec2(63, 63), 0, tcu::CUBEFACE_POSITIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1_neg_x",	"", IVec2(64, 64), IVec2(31, 31), 1, tcu::CUBEFACE_NEGATIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",		"", IVec2(64, 64), IVec2(0,0)	, 0));
	// Cube format.
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0",					"", IVec2(64, 64), GL_RGB,				GL_RGBA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0",					"", IVec2(64, 64), GL_RGBA,				GL_RGB));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha_level_0",	"", IVec2(64, 64), GL_LUMINANCE,		GL_LUMINANCE_ALPHA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance_level_0",	"", IVec2(64, 64), GL_LUMINANCE_ALPHA,	GL_LUMINANCE));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0_pos_z",				"", IVec2(64, 64), GL_RGB,				GL_RGBA,	tcu::CUBEFACE_POSITIVE_Z));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0_neg_z",				"", IVec2(64, 64), GL_RGBA,				GL_RGB,		tcu::CUBEFACE_NEGATIVE_Z));
	// Cube missing level.
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",		"", IVec2(64, 64), 1));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",		"", IVec2(64, 64), 3));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1_pos_y",	"", IVec2(64, 64), 1, tcu::CUBEFACE_POSITIVE_Y));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3_neg_y",	"", IVec2(64, 64), 3, tcu::CUBEFACE_NEGATIVE_Y));
	// Cube wrap modes.
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	// Cube extra level.
	cube->addChild(new CompleteCubeExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Cube extra level.
	cube->addChild(new IncompleteCubeEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));
}